

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

string * __thiscall
t_c_glib_generator::generate_hash_func_from_type_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  char *pcVar3;
  char *pcVar4;
  
  do {
    if ((t_typedef *)ttype == (t_typedef *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "NULL";
      pcVar3 = "";
LAB_00172a9b:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar3);
      return __return_storage_ptr__;
    }
    iVar1 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[5])(ttype);
    if ((char)iVar1 != '\0') {
      switch(*(undefined4 *)&((t_typedef *)ttype)->type_) {
      case 0:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar3 = "compiler error: cannot determine hash type";
        break;
      case 1:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "g_str_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      case 2:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "thrift_boolean_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      case 3:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "thrift_int8_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      case 4:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "thrift_int16_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      case 5:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "g_int_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      case 6:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "g_int64_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      case 7:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "g_double_hash";
        pcVar3 = "";
        goto LAB_00172a9b;
      default:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar3 = "compiler error: no hash table info for type";
      }
LAB_00172ba7:
      *puVar2 = pcVar3;
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    iVar1 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[10])(ttype);
    if ((((char)iVar1 != '\0') ||
        (iVar1 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[0xd])(ttype),
        (char)iVar1 != '\0')) ||
       (iVar1 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[0xb])(ttype),
       (char)iVar1 != '\0')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "g_direct_hash";
      pcVar3 = "";
      goto LAB_00172a9b;
    }
    iVar1 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[9])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[3])(ttype);
      printf("Type not expected: %s\n",*(undefined8 *)CONCAT44(extraout_var,iVar1));
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar3 = "Type not expected";
      goto LAB_00172ba7;
    }
    ttype = t_typedef::get_type((t_typedef *)ttype);
  } while( true );
}

Assistant:

string t_c_glib_generator::generate_hash_func_from_type(t_type* ttype) {
  if (ttype == nullptr)
    return "NULL";

  if (ttype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot determine hash type";
      break;
    case t_base_type::TYPE_BOOL:
      return "thrift_boolean_hash";
    case t_base_type::TYPE_I8:
      return "thrift_int8_hash";
    case t_base_type::TYPE_I16:
      return "thrift_int16_hash";
    case t_base_type::TYPE_I32:
      return "g_int_hash";
    case t_base_type::TYPE_I64:
      return "g_int64_hash";
    case t_base_type::TYPE_DOUBLE:
      return "g_double_hash";
    case t_base_type::TYPE_STRING:
      return "g_str_hash";
    default:
      throw "compiler error: no hash table info for type";
    }
  } else if (ttype->is_enum()) {
    return "g_direct_hash";
  } else if (ttype->is_container() || ttype->is_struct()) {
    return "g_direct_hash";
  } else if (ttype->is_typedef()) {
    return generate_hash_func_from_type(((t_typedef*)ttype)->get_type());
  }
  printf("Type not expected: %s\n", ttype->get_name().c_str());
  throw "Type not expected";
}